

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_GetPropertyInt64(JSContext *ctx,JSValue obj,int64_t idx)

{
  JSValue this_obj;
  JSValue JVar1;
  JSAtom JVar2;
  JSContext *in_RCX;
  undefined8 in_RDX;
  int64_t in_RSI;
  JSValueUnion in_RDI;
  JSValue JVar3;
  JSValue val;
  JSAtom prop;
  JSAtom in_stack_0000008c;
  JSContext *in_stack_00000090;
  undefined1 in_stack_00000098 [16];
  undefined1 in_stack_000000a8 [16];
  BOOL in_stack_00000130;
  JSAtom in_stack_ffffffffffffff3c;
  JSContext *in_stack_ffffffffffffff40;
  int64_t in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffa4;
  undefined8 local_58;
  undefined8 local_28;
  
  if (in_RCX < (JSContext *)0x80000000) {
    this_obj.tag._0_4_ = in_stack_ffffffffffffffa0;
    this_obj.u = (JSValueUnion)in_RDX;
    this_obj.tag._4_4_ = in_stack_ffffffffffffffa4;
    JVar3.tag = in_RSI;
    JVar3.u.float64 = in_RDI.float64;
    JVar3 = JS_GetPropertyValue(in_RCX,this_obj,JVar3);
    uVar4 = JVar3.u._0_4_;
    in_stack_ffffffffffffffa4 = JVar3.u._4_4_;
    local_58 = JVar3.tag;
  }
  else {
    JVar2 = JS_NewAtomInt64((JSContext *)
                            CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                            in_stack_ffffffffffffff70);
    if (JVar2 == 0) {
      uVar4 = 0;
      local_58 = 6;
    }
    else {
      JVar3 = JS_GetPropertyInternal
                        (in_stack_00000090,(JSValue)in_stack_000000a8,in_stack_0000008c,
                         (JSValue)in_stack_00000098,in_stack_00000130);
      local_28 = JVar3.tag;
      JS_FreeAtom(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      uVar4 = JVar3.u._0_4_;
      in_stack_ffffffffffffffa4 = JVar3.u._4_4_;
      local_58 = local_28;
    }
  }
  JVar1.u._4_4_ = in_stack_ffffffffffffffa4;
  JVar1.u.int32 = uVar4;
  JVar1.tag = local_58;
  return JVar1;
}

Assistant:

static JSValue JS_GetPropertyInt64(JSContext *ctx, JSValueConst obj, int64_t idx)
{
    JSAtom prop;
    JSValue val;

    if ((uint64_t)idx <= INT32_MAX) {
        /* fast path for fast arrays */
        return JS_GetPropertyValue(ctx, obj, JS_NewInt32(ctx, idx));
    }
    prop = JS_NewAtomInt64(ctx, idx);
    if (prop == JS_ATOM_NULL)
        return JS_EXCEPTION;

    val = JS_GetProperty(ctx, obj, prop);
    JS_FreeAtom(ctx, prop);
    return val;
}